

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

void henson::Scheduler::create_group
               (size_t first,size_t last,MPI_Comm parent_comm,MPI_Group *new_group)

{
  size_t i;
  long lVar1;
  long lVar2;
  MPI_Group parent_group;
  vector<int,_std::allocator<int>_> group_array;
  allocator_type local_49;
  undefined8 local_48;
  value_type_conflict2 local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  MPI_Comm_group(parent_comm,&local_48);
  local_3c = -1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,(last - first) + 1,&local_3c,&local_49);
  lVar2 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
          (long)local_38._M_impl.super__Vector_impl_data._M_start >> 2;
  for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
    local_38._M_impl.super__Vector_impl_data._M_start[lVar1] = (int)first + (int)lVar1;
  }
  MPI_Group_incl(local_48,lVar2,local_38._M_impl.super__Vector_impl_data._M_start,new_group);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

static void create_group(size_t first, size_t last, MPI_Comm parent_comm, MPI_Group* new_group)
        {
            MPI_Group parent_group;
            MPI_Comm_group(parent_comm, &parent_group);

            std::vector<int> group_array(last - first + 1, -1);
            for(size_t i = 0; i < group_array.size(); ++i)
                group_array[i] = first + i;

            MPI_Group_incl(parent_group, group_array.size(), group_array.data(), new_group);
        }